

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

void __thiscall
xatlas::internal::UniformGrid2::computePotentialEdges(UniformGrid2 *this,Vector2 p1,Vector2 p2)

{
  uint32_t uVar1;
  uint *puVar2;
  uint32_t j;
  uint index;
  Array<unsigned_int> *this_00;
  uint index_00;
  uint32_t edge2;
  uint local_44;
  Array<unsigned_int> *local_40;
  Array<unsigned_int> *local_38;
  
  (this->m_potentialEdges).m_base.size = 0;
  traverse(this,p1,p2);
  local_38 = &this->m_traversedCellOffsets;
  local_40 = &this->m_cellDataOffsets;
  for (index = 0; index < (this->m_traversedCellOffsets).m_base.size; index = index + 1) {
    puVar2 = Array<unsigned_int>::operator[](local_38,index);
    index_00 = *puVar2;
    this_00 = local_40;
    while( true ) {
      puVar2 = Array<unsigned_int>::operator[](this_00,index_00);
      uVar1 = *puVar2;
      if (uVar1 == 0xffffffff) break;
      puVar2 = Array<unsigned_int>::operator[](&this->m_cellData,uVar1);
      local_44 = *puVar2;
      ArrayBase::push_back(&(this->m_potentialEdges).m_base,(uint8_t *)&local_44);
      index_00 = uVar1 + 1;
      this_00 = &this->m_cellData;
    }
  }
  uVar1 = (this->m_potentialEdges).m_base.size;
  if (uVar1 != 0) {
    insertionSort<unsigned_int>((uint *)(this->m_potentialEdges).m_base.buffer,uVar1);
  }
  return;
}

Assistant:

void computePotentialEdges(Vector2 p1, Vector2 p2)
	{
		m_potentialEdges.clear();
		traverse(p1, p2);
		for (uint32_t j = 0; j < m_traversedCellOffsets.size(); j++) {
			const uint32_t cell = m_traversedCellOffsets[j];
			uint32_t offset = m_cellDataOffsets[cell];
			while (offset != UINT32_MAX) {
				const uint32_t edge2 = m_cellData[offset];
				m_potentialEdges.push_back(edge2);
				offset = m_cellData[offset + 1];
			}
		}
		if (m_potentialEdges.isEmpty())
			return;
		insertionSort(m_potentialEdges.data(), m_potentialEdges.size());
	}